

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::instrs<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err> *this;
  undefined8 *puVar1;
  _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err> *this_00
  ;
  undefined1 *puVar2;
  uint pos;
  undefined8 uVar3;
  bool bVar4;
  Index IVar5;
  Index IVar6;
  Result<wasm::WATParser::Ok> *extraout_RAX;
  Result<wasm::WATParser::Ok> *extraout_RAX_00;
  Result<wasm::WATParser::Ok> *extraout_RAX_01;
  Result<wasm::WATParser::Ok> *pRVar7;
  Result<wasm::WATParser::Ok> *extraout_RAX_02;
  string local_158;
  undefined8 *local_138;
  size_type __dnew_1;
  undefined8 local_128;
  undefined8 uStack_120;
  string local_118;
  string local_f8;
  undefined1 auStack_d8 [8];
  MaybeResult<wasm::WATParser::Ok> blockinst;
  MaybeResult<wasm::WATParser::Ok> _val_1;
  MaybeResult<wasm::WATParser::Ok> _val;
  pointer ppStack_58;
  vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
  foldedInstrs;
  
  this = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          *)((long)&_val_1.val.
                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            + 0x20);
  this_00 = (_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             *)((long)&blockinst.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20);
  do {
    while( true ) {
      foldedBlockinstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                ((MaybeResult<wasm::WATParser::Ok> *)auStack_d8,ctx);
      if (blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ == '\x01') break;
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)this,(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)auStack_d8);
      if (_val.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ == '\x02') {
        blockinst.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._32_8_ = (long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&blockinst.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),CONCAT44(_val_1.val.
                                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    ._36_4_,_val_1.val.
                                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            .
                                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            ._32_4_),
                   CONCAT44(_val.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._4_4_,
                            _val.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._0_4_) +
                   CONCAT44(_val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._36_4_,_val_1.val.
                                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    ._32_4_));
        goto LAB_009f3a9e;
      }
LAB_009f358a:
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage(this);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)auStack_d8);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)auStack_d8);
    bVar4 = ParseInput::takeLParen(&ctx->in);
    if (!bVar4) {
      instr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                ((MaybeResult<wasm::WATParser::Ok> *)auStack_d8,ctx);
      if (blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ == '\x01') {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)auStack_d8);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
             '\0';
        return __return_storage_ptr__;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)this,(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)auStack_d8);
      if (_val.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ != '\x02') goto LAB_009f358a;
      blockinst.val.
      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      ._32_8_ = (long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&blockinst.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20),CONCAT44(_val_1.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  ._36_4_,_val_1.val.
                                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          ._32_4_),
                 CONCAT44(_val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._4_4_,
                          _val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._0_4_) +
                 CONCAT44(_val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._36_4_,_val_1.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  ._32_4_));
LAB_009f3a9e:
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
      if ((undefined1 *)
          blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._32_8_ ==
          (undefined1 *)
          ((long)&_val_1.val.
                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          + 8U)) {
        *puVar1 = CONCAT71(_val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           ._M_u._9_7_,
                           _val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           ._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
             _val_1.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
             blockinst.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                  0x10) =
             CONCAT71(_val_1.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._9_7_,
                      _val_1.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._8_1_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           ._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
           '\x01';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&_val_1.val.
                                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)auStack_d8);
      return extraout_RAX_00;
    }
    ppStack_58 = (pointer)0x0;
    foldedInstrs.
    super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    foldedInstrs.
    super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_d8._0_4_ = ParseInput::getPos(&ctx->in);
    auStack_d8._4_4_ = 0;
    blockinst.val.
    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    _M_u._0_4_ = 0;
    if (foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
      ::_M_realloc_insert<std::pair<unsigned_int,std::optional<unsigned_int>>>
                ((vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
                  *)&ppStack_58,
                 (iterator)
                 foldedInstrs.
                 super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pair<unsigned_int,_std::optional<unsigned_int>_> *)auStack_d8);
    }
    else {
      *(undefined4 *)
       &((foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->second).
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = 0;
      (foldedInstrs.
       super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->first = (int)(ulong)(uint)auStack_d8._0_4_;
      ((foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->second).
      super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           (_Storage<unsigned_int,_true>)(int)((ulong)(uint)auStack_d8._0_4_ >> 0x20);
      foldedInstrs.
      super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           foldedInstrs.
           super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    if (ppStack_58 !=
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        bVar4 = ParseInput::takeUntilParen(&ctx->in);
        if (!bVar4) {
          IVar5 = foldedInstrs.
                  super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].first;
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_index = '\x1f';
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._33_3_ = 0;
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._36_4_ = 0;
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          local_158._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create
                                  ((ulong *)&local_158,
                                   (ulong)((long)&_val_1.val.
                                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          + 0x20));
          local_158._M_string_length =
               CONCAT44(_val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._36_4_,_val_1.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                ._32_4_);
          builtin_strncpy(local_158._M_dataplus._M_p,"unterminated folded instruction",0x1f);
          local_158._M_dataplus._M_p[local_158._M_string_length] = '\0';
          local_158.field_2._M_allocated_capacity = local_158._M_string_length;
          ParseInput::err((Err *)auStack_d8,&ctx->in,IVar5,&local_158);
          uVar3._4_4_ = _val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._36_4_;
          uVar3._0_1_ = _val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_index;
          uVar3._1_3_ = _val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._33_3_;
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                   0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
          pRVar7 = (Result<wasm::WATParser::Ok> *)
                   ((long)&blockinst.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 8);
          if ((Result<wasm::WATParser::Ok> *)CONCAT44(auStack_d8._4_4_,auStack_d8._0_4_) == pRVar7)
          {
            *puVar1 = CONCAT71(blockinst.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._M_u._9_7_,
                               blockinst.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18)
                 = blockinst.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   ._M_u._16_8_;
          }
          else {
            *(Result<wasm::WATParser::Ok> **)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
                 (Result<wasm::WATParser::Ok> *)CONCAT44(auStack_d8._4_4_,auStack_d8._0_4_);
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                      + 0x10) =
                 CONCAT71(blockinst.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          blockinst.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
          }
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                    + 8) =
               CONCAT44(blockinst.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._4_4_,
                        blockinst.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._0_4_);
          blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._0_4_ = 0;
          blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._4_4_ = 0;
          blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
               '\x01';
          auStack_d8 = (undefined1  [8])pRVar7;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
            uVar3._4_4_ = _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._36_4_;
            uVar3._0_1_ = _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_index;
            uVar3._1_3_ = _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._33_3_;
            pRVar7 = extraout_RAX;
          }
          goto LAB_009f3bc0;
        }
        if (foldedInstrs.
            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].second.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == false) {
          IVar5 = ParseInput::getPos(&ctx->in);
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].second.
          super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_payload_base<unsigned_int>)((ulong)IVar5 | 0x100000000);
        }
        foldedBlockinstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                  ((MaybeResult<wasm::WATParser::Ok> *)auStack_d8,ctx);
        if (blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._24_1_ != '\x01') {
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)this,(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   *)auStack_d8);
          if (_val.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ != '\x02') {
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage(this);
            goto LAB_009f3722;
          }
          puVar2 = (undefined1 *)
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 8);
          blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._32_8_ = puVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&blockinst.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x20),CONCAT44(_val_1.val.
                                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      ._36_4_,_val_1.val.
                                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                              .
                                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                              ._32_4_),
                     CONCAT44(_val.val.
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              ._M_u._4_4_,
                              _val.val.
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              ._M_u._0_4_) +
                     CONCAT44(_val_1.val.
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              ._36_4_,_val_1.val.
                                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      ._32_4_));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                   0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
          if ((undefined1 *)
              blockinst.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._32_8_ == puVar2) {
            *puVar1 = CONCAT71(_val_1.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._M_u._9_7_,
                               _val_1.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18)
                 = _val_1.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   ._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
                 blockinst.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                      + 0x10) =
                 CONCAT71(_val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
               _val_1.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._M_u._0_8_;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
               '\x01';
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)((long)&_val_1.val.
                                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 + 0x20));
LAB_009f3bb4:
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)auStack_d8);
          pRVar7 = extraout_RAX_01;
          auStack_d8 = (undefined1  [8])CONCAT44(auStack_d8._4_4_,auStack_d8._0_4_);
          uVar3 = _val_1.val.
                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._32_8_;
LAB_009f3bc0:
          if (ppStack_58 == (pointer)0x0) {
            return pRVar7;
          }
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._32_8_ = uVar3;
          operator_delete(ppStack_58,
                          (long)foldedInstrs.
                                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
          return extraout_RAX_02;
        }
        bVar4 = ParseInput::takeLParen(&ctx->in);
        if (!bVar4) {
          bVar4 = ParseInput::takeRParen(&ctx->in);
          if (!bVar4) {
            handle_unreachable("expected paren",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                               ,0xb56);
          }
          if ((foldedInstrs.
               super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].second.
               super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged & 1U) == 0) {
            __assert_fail("end && \"Should have found end of instruction\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                          ,0xb47,
                          "Result<typename Ctx::InstrsT> wasm::WATParser::(anonymous namespace)::instrs(Ctx &) [Ctx = wasm::WATParser::(anonymous namespace)::ParseDeclsCtx]"
                         );
          }
          pos = foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].first;
          IVar5 = foldedInstrs.
                  super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].second.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_payload._M_value;
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               foldedInstrs.
               super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
          _val.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._36_4_ = ParseInput::getPos(&ctx->in);
          (ctx->in).lexer.index = (ulong)pos;
          Lexer::skipSpace((Lexer *)ctx);
          Lexer::lexToken((Lexer *)ctx);
          plaininstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                    ((MaybeResult<wasm::WATParser::Ok> *)this,ctx);
          if (_val.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ == '\x01') {
            local_138 = (undefined8 *)0x1b;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            local_118._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_118,(ulong)&local_138);
            local_118.field_2._M_allocated_capacity = (size_type)local_138;
            builtin_strncpy(local_118._M_dataplus._M_p,"expected folded instruction",0x1b);
            local_118._M_string_length = (size_type)local_138;
            local_118._M_dataplus._M_p[(long)local_138] = '\0';
            ParseInput::err((Err *)((long)&blockinst.val.
                                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   + 0x20),&ctx->in,pos,&local_118);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                     + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
            puVar2 = (undefined1 *)
                     ((long)&_val_1.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 8);
            if ((undefined1 *)
                blockinst.val.
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._32_8_ == puVar2) {
              *puVar1 = CONCAT71(_val_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._M_u._9_7_,
                                 _val_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
               0x18) = _val_1.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       ._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
                   blockinst.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   ._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                        + 0x10) =
                   CONCAT71(_val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._9_7_,
                            _val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
                 _val_1.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._M_u._0_8_;
            _val_1.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._0_8_ = 0;
            _val_1.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                 = '\x01';
            blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ = puVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
LAB_009f3b61:
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 *)((long)&_val_1.val.
                                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   + 0x20));
          }
          else {
            std::__detail::__variant::
            _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)this_00,
                              (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)this);
            if (_val_1.val.
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._M_u._24_1_ == '\x02') {
              local_138 = &local_128;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,
                         blockinst.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         ._32_8_,_val_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._M_u._0_8_ +
                                 blockinst.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._32_8_);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                       + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
              if (local_138 == &local_128) {
                *puVar1 = local_128;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                 0x18) = uStack_120;
              }
              else {
                *(undefined8 **)
                 &(__return_storage_ptr__->val).
                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
                     local_138;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                 0x10) = local_128;
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8)
                   = __dnew_1;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
               0x20) = '\x01';
              std::__detail::__variant::
              _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   *)((long)&blockinst.val.
                                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     + 0x20));
              goto LAB_009f3b61;
            }
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage(this_00);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage(this);
            IVar6 = ParseInput::getPos(&ctx->in);
            if (IVar6 == IVar5) {
              WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>::~WithPosition
                        ((WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> *)ctx)
              ;
              goto LAB_009f3722;
            }
            blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_index = '\x1b';
            blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._33_7_ = 0;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)&local_f8,
                                     (ulong)((long)&blockinst.val.
                                                                                                        
                                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                            + 0x20));
            local_f8.field_2._M_allocated_capacity =
                 blockinst.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._32_8_;
            builtin_strncpy(local_f8._M_dataplus._M_p,"expected end of instruction",0x1b);
            local_f8._M_string_length =
                 blockinst.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._32_8_;
            local_f8._M_dataplus._M_p
            [blockinst.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_] = '\0';
            ParseInput::err((Err *)((long)&_val_1.val.
                                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   + 0x20),&ctx->in,&local_f8);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                     + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
            puVar2 = (undefined1 *)
                     ((long)&_val.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 8);
            if ((undefined1 *)
                CONCAT44(_val_1.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         ._36_4_,_val_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._32_4_) == puVar2) {
              *puVar1 = CONCAT71(_val.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._M_u._9_7_,
                                 _val.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
               0x18) = _val.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       ._M_u._16_8_;
            }
            else {
              *(undefined1 **)
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
                   (undefined1 *)
                   CONCAT44(_val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._36_4_,_val_1.val.
                                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                    ._32_4_);
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                        + 0x10) =
                   CONCAT71(_val.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._9_7_,
                            _val.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._8_1_);
            }
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                      + 8) =
                 CONCAT44(_val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._4_4_,
                          _val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._0_4_);
            _val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._0_4_ = 0;
            _val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._4_4_ = 0;
            _val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                 = '\x01';
            _val_1.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ = puVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
          }
          WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>::~WithPosition
                    ((WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> *)ctx);
          goto LAB_009f3bb4;
        }
        _val_1.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._32_4_ = ParseInput::getPos(&ctx->in);
        _val_1.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._36_4_ = 0;
        _val.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._0_4_ = 0;
        if (foldedInstrs.
            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            foldedInstrs.
            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
          ::_M_realloc_insert<std::pair<unsigned_int,std::optional<unsigned_int>>>
                    ((vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
                      *)&ppStack_58,
                     (iterator)
                     foldedInstrs.
                     super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pair<unsigned_int,_std::optional<unsigned_int>_> *)this);
        }
        else {
          *(undefined4 *)
           &((foldedInstrs.
              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second).
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = 0;
          (foldedInstrs.
           super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first =
               (int)(ulong)(uint)_val_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 ._32_4_;
          ((foldedInstrs.
            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->second).
          super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload =
               (_Storage<unsigned_int,_true>)
               (int)((ulong)(uint)_val_1.val.
                                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  ._32_4_ >> 0x20);
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               foldedInstrs.
               super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
LAB_009f3722:
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)auStack_d8);
      } while (ppStack_58 !=
               foldedInstrs.
               super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    if (ppStack_58 != (pointer)0x0) {
      operator_delete(ppStack_58,
                      (long)foldedInstrs.
                            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_58);
    }
  } while( true );
}

Assistant:

Result<typename Ctx::InstrsT> instrs(Ctx& ctx) {
  auto insts = ctx.makeInstrs();

  while (true) {
    if (auto blockinst = foldedBlockinstr(ctx)) {
      CHECK_ERR(blockinst);
      ctx.appendInstr(insts, *blockinst);
      continue;
    }
    // Parse an arbitrary number of folded instructions.
    if (ctx.in.takeLParen()) {
      // A stack of (start, end) position pairs defining the positions of
      // instructions that need to be parsed after their folded children.
      std::vector<std::pair<Index, std::optional<Index>>> foldedInstrs;

      // Begin a folded instruction. Push its start position and a placeholder
      // end position.
      foldedInstrs.push_back({ctx.in.getPos(), {}});
      while (!foldedInstrs.empty()) {
        // Consume everything up to the next paren. This span will be parsed as
        // an instruction later after its folded children have been parsed.
        if (!ctx.in.takeUntilParen()) {
          return ctx.in.err(foldedInstrs.back().first,
                            "unterminated folded instruction");
        }

        if (!foldedInstrs.back().second) {
          // The folded instruction we just started should end here.
          foldedInstrs.back().second = ctx.in.getPos();
        }

        // We have either the start of a new folded child or the end of the last
        // one.
        if (auto blockinst = foldedBlockinstr(ctx)) {
          CHECK_ERR(blockinst);
          ctx.appendInstr(insts, *blockinst);
        } else if (ctx.in.takeLParen()) {
          foldedInstrs.push_back({ctx.in.getPos(), {}});
        } else if (ctx.in.takeRParen()) {
          auto [start, end] = foldedInstrs.back();
          assert(end && "Should have found end of instruction");
          foldedInstrs.pop_back();

          WithPosition with(ctx, start);
          if (auto inst = plaininstr(ctx)) {
            CHECK_ERR(inst);
            ctx.appendInstr(insts, *inst);
          } else {
            return ctx.in.err(start, "expected folded instruction");
          }

          if (ctx.in.getPos() != *end) {
            return ctx.in.err("expected end of instruction");
          }
        } else {
          WASM_UNREACHABLE("expected paren");
        }
      }
      continue;
    }

    // A non-folded instruction.
    if (auto inst = instr(ctx)) {
      CHECK_ERR(inst);
      ctx.appendInstr(insts, *inst);
    } else {
      break;
    }
  }

  return ctx.finishInstrs(insts);
}